

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall cmsys::CommandLineArguments::GenerateHelp(CommandLineArguments *this)

{
  Internal *pIVar1;
  bool bVar2;
  pointer ppVar3;
  set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_> *psVar4;
  pointer ppVar5;
  undefined8 uVar6;
  reference pSVar7;
  mapped_type *pmVar8;
  pair<std::_Rb_tree_const_iterator<cmsys::String>,_bool> pVar9;
  string local_4f0 [32];
  _Base_ptr local_4d0;
  size_type local_4c8;
  size_type skip;
  size_type cc;
  size_t sStack_4b0;
  int cnt;
  size_t len;
  char *ptr;
  char local_498 [8];
  char buffer [80];
  char argument [100];
  _Rb_tree_const_iterator<cmsys::String> local_3d0;
  iterator sit_2;
  char local_3b8 [8];
  char format [80];
  ulong local_350;
  size_type clen;
  _Base_ptr local_340;
  _Rb_tree_const_iterator<cmsys::String> local_338;
  iterator sit_1;
  ulong local_320;
  size_type maxlen;
  _Self local_2d8;
  _Base_ptr local_2d0;
  _Rb_tree_const_iterator<cmsys::String> local_2c8;
  iterator sit;
  _Self local_2a8;
  String local_2a0;
  _Base_ptr local_280;
  CommandLineArgumentsCallbackStructure *local_278;
  CommandLineArgumentsCallbackStructure *cs_1;
  _Base_ptr local_268;
  _Base_ptr local_260;
  _Base_ptr local_258;
  undefined1 local_250;
  _Base_ptr local_248;
  undefined1 local_240;
  _Base_ptr local_238;
  undefined1 local_230;
  _Self local_228 [3];
  String local_210;
  _Base_ptr local_1f0;
  CommandLineArgumentsCallbackStructure *local_1e8;
  CommandLineArgumentsCallbackStructure *cs;
  _Base_ptr local_1d8;
  _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
  local_1d0;
  iterator smpit;
  iterator mpit;
  MapArgs mp;
  iterator it;
  ostringstream str;
  CommandLineArguments *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
  std::
  _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>::
  _Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                     *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
  ::map((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
         *)&mpit);
  std::_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>::
  _Rb_tree_iterator(&smpit);
  std::_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>::
  _Rb_tree_iterator(&local_1d0);
  local_1d8 = (_Base_ptr)
              std::
              map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ::begin(&(this->Internals->Callbacks).
                       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                     );
  mp._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_1d8;
  while( true ) {
    cs = (CommandLineArgumentsCallbackStructure *)
         std::
         map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
         ::end(&(this->Internals->Callbacks).
                super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              );
    bVar2 = std::operator!=((_Self *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (_Self *)&cs);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                           *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_1e8 = &ppVar3->second;
    String::String(&local_210,(ppVar3->second).Help);
    local_1f0 = (_Base_ptr)
                std::
                map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                ::find((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                        *)&mpit,&local_210);
    smpit._M_node = local_1f0;
    String::~String(&local_210);
    local_228[0]._M_node =
         (_Base_ptr)
         std::
         map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
         ::end((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                *)&mpit);
    bVar2 = std::operator!=(&smpit,local_228);
    if (bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
               ::operator->(&smpit);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pVar9 = std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::
              insert(&(ppVar5->second).
                      super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                     ,&ppVar3->first);
      local_238 = (_Base_ptr)pVar9.first._M_node;
      local_230 = pVar9.second;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar4 = &std::
                map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                              *)&mpit,&ppVar3->first)->
                super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pVar9 = std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::
              insert(psVar4,&ppVar3->first);
      local_248 = (_Base_ptr)pVar9.first._M_node;
      local_240 = pVar9.second;
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar4 = &std::
                map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                              *)&mpit,&ppVar3->first)->
                super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pVar9 = std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::
              insert(psVar4,&ppVar3->first);
      local_258 = (_Base_ptr)pVar9.first._M_node;
      local_250 = pVar9.second;
    }
    local_260 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                ::operator++((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                              *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
  }
  local_268 = (_Base_ptr)
              std::
              map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
              ::begin(&(this->Internals->Callbacks).
                       super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                     );
  mp._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_268;
  while( true ) {
    cs_1 = (CommandLineArgumentsCallbackStructure *)
           std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::end(&(this->Internals->Callbacks).
                  super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                );
    bVar2 = std::operator!=((_Self *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (_Self *)&cs_1);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                           *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_278 = &ppVar3->second;
    String::String(&local_2a0,(ppVar3->second).Help);
    local_280 = (_Base_ptr)
                std::
                map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                ::find((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                        *)&mpit,&local_2a0);
    smpit._M_node = local_280;
    String::~String(&local_2a0);
    local_2a8._M_node =
         (_Base_ptr)
         std::
         map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
         ::end((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                *)&mpit);
    bVar2 = std::operator!=(&smpit,&local_2a8);
    if (bVar2) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
               ::operator->(&smpit);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::insert
                (&(ppVar5->second).
                  super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                 ,&ppVar3->first);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      sit._M_node = (_Base_ptr)
                    std::
                    map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                    ::find((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                            *)&mpit,&ppVar3->first);
      local_1d0._M_node = sit._M_node;
      std::_Rb_tree_const_iterator<cmsys::String>::_Rb_tree_const_iterator(&local_2c8);
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
               ::operator->(&local_1d0);
      local_2d0 = (_Base_ptr)
                  std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                  ::begin(&(ppVar5->second).
                           super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                         );
      local_2c8._M_node = local_2d0;
      while( true ) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
                 ::operator->(&local_1d0);
        local_2d8._M_node =
             (_Base_ptr)
             std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::end
                       (&(ppVar5->second).
                         super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                       );
        bVar2 = std::operator!=(&local_2c8,&local_2d8);
        if (!bVar2) break;
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
                 ::operator->(&smpit);
        pSVar7 = std::_Rb_tree_const_iterator<cmsys::String>::operator*(&local_2c8);
        std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::insert
                  (&(ppVar5->second).
                    super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                   ,pSVar7);
        std::_Rb_tree_const_iterator<cmsys::String>::operator++(&local_2c8,0);
      }
      std::
      map<cmsys::String,cmsys::CommandLineArgumentsSetOfStrings,std::less<cmsys::String>,std::allocator<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>>
      ::erase_abi_cxx11_((map<cmsys::String,cmsys::CommandLineArgumentsSetOfStrings,std::less<cmsys::String>,std::allocator<std::pair<cmsys::String_const,cmsys::CommandLineArgumentsSetOfStrings>>>
                          *)&mpit,(iterator)local_1d0._M_node);
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      psVar4 = &std::
                map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                ::operator[]((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                              *)&mpit,&ppVar3->first)->
                super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                             *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::insert
                (psVar4,&ppVar3->first);
    }
    std::
    _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
                  *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
  }
  local_320 = 0;
  smpit = std::
          map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
          ::begin((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                   *)&mpit);
  while( true ) {
    sit_1._M_node =
         (_Base_ptr)
         std::
         map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
         ::end((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                *)&mpit);
    bVar2 = std::operator!=(&smpit,(_Self *)&sit_1);
    if (!bVar2) break;
    std::_Rb_tree_const_iterator<cmsys::String>::_Rb_tree_const_iterator(&local_338);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
             ::operator->(&smpit);
    local_340 = (_Base_ptr)
                std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::
                begin(&(ppVar5->second).
                       super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                     );
    local_338._M_node = local_340;
    while( true ) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
               ::operator->(&smpit);
      clen = (size_type)
             std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::end
                       (&(ppVar5->second).
                         super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                       );
      bVar2 = std::operator!=(&local_338,(_Self *)&clen);
      if (!bVar2) break;
      std::_Rb_tree_const_iterator<cmsys::String>::operator->(&local_338);
      local_350 = std::__cxx11::string::size();
      pIVar1 = this->Internals;
      pSVar7 = std::_Rb_tree_const_iterator<cmsys::String>::operator*(&local_338);
      pmVar8 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(pIVar1->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,pSVar7);
      switch(pmVar8->ArgumentType) {
      case 0:
        break;
      case 1:
        local_350 = local_350 + 3;
        break;
      case 2:
        local_350 = local_350 + 4;
        break;
      case 3:
        local_350 = local_350 + 4;
      }
      if (local_320 < local_350) {
        local_320 = local_350;
      }
      std::_Rb_tree_const_iterator<cmsys::String>::operator++(&local_338,0);
    }
    std::_Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
    ::operator++(&smpit,0);
  }
  sprintf(local_3b8,"  %%-%us  ",local_320 & 0xffffffff);
  local_320 = local_320 + 4;
  smpit = std::
          map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
          ::begin((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                   *)&mpit);
  do {
    sit_2._M_node =
         (_Base_ptr)
         std::
         map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
         ::end((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
                *)&mpit);
    bVar2 = std::operator!=(&smpit,(_Self *)&sit_2);
    if (!bVar2) {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)&this->Help,local_4f0);
      std::__cxx11::string::~string(local_4f0);
      std::
      map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
      ::~map((map<cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>_>
              *)&mpit);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
      return;
    }
    std::_Rb_tree_const_iterator<cmsys::String>::_Rb_tree_const_iterator(&local_3d0);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
             ::operator->(&smpit);
    local_3d0._M_node =
         (_Base_ptr)
         std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::begin
                   (&(ppVar5->second).
                     super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                   );
    while( true ) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
               ::operator->(&smpit);
      register0x00000000 =
           std::set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>::end
                     (&(ppVar5->second).
                       super_set<cmsys::String,_std::less<cmsys::String>,_std::allocator<cmsys::String>_>
                     );
      bVar2 = std::operator!=(&local_3d0,(_Self *)(argument + 0x60));
      if (!bVar2) break;
      std::ostream::operator<<(&it,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_const_iterator<cmsys::String>::operator->(&local_3d0);
      uVar6 = std::__cxx11::string::c_str();
      sprintf(buffer + 0x48,"%s",uVar6);
      pIVar1 = this->Internals;
      pSVar7 = std::_Rb_tree_const_iterator<cmsys::String>::operator*(&local_3d0);
      pmVar8 = std::
               map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
               ::operator[](&(pIVar1->Callbacks).
                             super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                            ,pSVar7);
      switch(pmVar8->ArgumentType) {
      case 0:
        break;
      case 1:
        strcat(buffer + 0x48,"opt");
        break;
      case 2:
        strcat(buffer + 0x48," opt");
        break;
      case 3:
        strcat(buffer + 0x48,"=opt");
        break;
      case 4:
        strcat(buffer + 0x48," opt opt ...");
      }
      sprintf(local_498,local_3b8,buffer + 0x48);
      std::operator<<((ostream *)&it,local_498);
      ptr = (char *)std::_Rb_tree_const_iterator<cmsys::String>::operator++(&local_3d0,0);
    }
    pIVar1 = this->Internals;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
             ::operator->(&smpit);
    pmVar8 = std::
             map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
             ::operator[](&(pIVar1->Callbacks).
                           super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                          ,&ppVar5->first);
    len = (size_t)pmVar8->Help;
    sStack_4b0 = strlen((char *)len);
    cc._4_4_ = 0;
    for (; sStack_4b0 != 0; sStack_4b0 = sStack_4b0 - local_4c8) {
      for (skip = 0; *(char *)(len + skip) != '\0'; skip = skip + 1) {
        if ((*(char *)len == ' ') || (*(char *)len == '\t')) {
          len = len + 1;
          sStack_4b0 = sStack_4b0 - 1;
        }
      }
      if (0 < cc._4_4_) {
        for (skip = 0; skip < local_320; skip = skip + 1) {
          std::operator<<((ostream *)&it," ");
        }
      }
      local_4c8 = sStack_4b0;
      if (this->LineLength - local_320 < sStack_4b0) {
        local_4c8 = this->LineLength - local_320;
        skip = local_4c8;
        do {
          skip = skip - 1;
          if ((skip == 0) || (*(char *)(len + skip) == ' ')) break;
        } while (*(char *)(len + skip) != '\t');
        if (skip != 0) {
          local_4c8 = skip;
        }
      }
      std::ostream::write((char *)&it,len);
      std::ostream::operator<<(&it,std::endl<char,std::char_traits<char>>);
      len = local_4c8 + len;
      cc._4_4_ = cc._4_4_ + 1;
    }
    local_4d0 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsSetOfStrings>_>
                ::operator++(&smpit,0);
  } while( true );
}

Assistant:

void CommandLineArguments::GenerateHelp()
{
  std::ostringstream str;
  
  // Collapse all arguments into the map of vectors of all arguments that do
  // the same thing.
  CommandLineArguments::Internal::CallbacksMap::iterator it;
  typedef std::map<CommandLineArguments::Internal::String,
     CommandLineArguments::Internal::SetOfStrings > MapArgs;
  MapArgs mp;
  MapArgs::iterator mpit, smpit;
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    CommandLineArgumentsCallbackStructure *cs = &(it->second);
    mpit = mp.find(cs->Help);
    if ( mpit != mp.end() )
      {
      mpit->second.insert(it->first);
      mp[it->first].insert(it->first);
      }
    else
      {
      mp[it->first].insert(it->first);
      }
    }
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    CommandLineArgumentsCallbackStructure *cs = &(it->second);
    mpit = mp.find(cs->Help);
    if ( mpit != mp.end() )
      {
      mpit->second.insert(it->first);
      smpit = mp.find(it->first);
      CommandLineArguments::Internal::SetOfStrings::iterator sit;
      for ( sit = smpit->second.begin(); sit != smpit->second.end(); sit++ )
        {
        mpit->second.insert(*sit);
        }
      mp.erase(smpit);
      }
    else
      {
      mp[it->first].insert(it->first);
      }
    }
 
  // Find the length of the longest string
  CommandLineArguments::Internal::String::size_type maxlen = 0;
  for ( mpit = mp.begin();
    mpit != mp.end();
    mpit ++ )
    {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for ( sit = mpit->second.begin(); sit != mpit->second.end(); sit++ )
      {
      CommandLineArguments::Internal::String::size_type clen = sit->size();
      switch ( this->Internals->Callbacks[*sit].ArgumentType )
        {
        case CommandLineArguments::NO_ARGUMENT:     clen += 0; break;
        case CommandLineArguments::CONCAT_ARGUMENT: clen += 3; break;
        case CommandLineArguments::SPACE_ARGUMENT:  clen += 4; break;
        case CommandLineArguments::EQUAL_ARGUMENT:  clen += 4; break;
        }
      if ( clen > maxlen )
        {
        maxlen = clen;
        }
      }
    }

  // Create format for that string
  char format[80];
  sprintf(format, "  %%-%us  ", static_cast<unsigned int>(maxlen));

  maxlen += 4; // For the space before and after the option

  // Print help for each option
  for ( mpit = mp.begin();
    mpit != mp.end();
    mpit ++ )
    {
    CommandLineArguments::Internal::SetOfStrings::iterator sit;
    for ( sit = mpit->second.begin(); sit != mpit->second.end(); sit++ )
      {
      str << std::endl;
      char argument[100];
      sprintf(argument, "%s", sit->c_str());
      switch ( this->Internals->Callbacks[*sit].ArgumentType )
        {
        case CommandLineArguments::NO_ARGUMENT: break;
        case CommandLineArguments::CONCAT_ARGUMENT: strcat(argument, "opt"); break;
        case CommandLineArguments::SPACE_ARGUMENT:  strcat(argument, " opt"); break;
        case CommandLineArguments::EQUAL_ARGUMENT:  strcat(argument, "=opt"); break;
        case CommandLineArguments::MULTI_ARGUMENT:  strcat(argument, " opt opt ..."); break;
        }
      char buffer[80];
      sprintf(buffer, format, argument);
      str << buffer;
      }
    const char* ptr = this->Internals->Callbacks[mpit->first].Help;
    size_t len = strlen(ptr);
    int cnt = 0;
    while ( len > 0)
      {
      // If argument with help is longer than line length, split it on previous
      // space (or tab) and continue on the next line
      CommandLineArguments::Internal::String::size_type cc;
      for ( cc = 0; ptr[cc]; cc ++ )
        {
        if ( *ptr == ' ' || *ptr == '\t' )
          {
          ptr ++;
          len --;
          }
        }
      if ( cnt > 0 )
        {
        for ( cc = 0; cc < maxlen; cc ++ )
          {
          str << " ";
          }
        }
      CommandLineArguments::Internal::String::size_type skip = len;
      if ( skip > this->LineLength - maxlen )
        {
        skip = this->LineLength - maxlen;
        for ( cc = skip-1; cc > 0; cc -- )
          {
          if ( ptr[cc] == ' ' || ptr[cc] == '\t' )
            {
            break;
            }
          }
        if ( cc != 0 )
          {
          skip = cc;
          }
        }
      str.write(ptr, static_cast<std::streamsize>(skip));
      str << std::endl;
      ptr += skip;
      len -= skip;
      cnt ++;
      }
    }
  /*
  // This can help debugging help string
  str << endl;
  unsigned int cc;
  for ( cc = 0; cc < this->LineLength; cc ++ )
    {
    str << cc % 10;
    }
  str << endl;
  */
  this->Help = str.str();
}